

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<google::sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
* __thiscall
google::
sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::insert_noresize(pair<google::sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
                  *__return_storage_ptr__,
                 sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                 *this,const_reference obj)

{
  bool bVar1;
  long lVar2;
  sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  *psVar3;
  pair<google::sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
  *ppVar4;
  byte bVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  nonempty_iterator local_80;
  sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
  local_60;
  
  bVar5 = 0;
  pVar6 = find_position<int>(this,obj);
  if (pVar6.first == 0xffffffffffffffff) {
    insert_at(&__return_storage_ptr__->first,this,obj,pVar6.second);
    bVar1 = true;
  }
  else {
    sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::get_iter
              (&local_80,&this->table,pVar6.first);
    local_60.end.row_begin._M_current =
         (this->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_60.end.row_end._M_current =
         (this->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_60.pos.row_current._M_current = local_80.row_current._M_current;
    local_60.pos.col_current = local_80.col_current;
    local_60.pos.row_begin._M_current = local_80.row_begin._M_current;
    local_60.pos.row_end._M_current = local_80.row_end._M_current;
    local_60.end.col_current = (nonempty_iterator)0x0;
    local_60.ht = this;
    local_60.end.row_current._M_current = local_60.end.row_end._M_current;
    sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
    ::advance_past_deleted(&local_60);
    psVar3 = &local_60;
    ppVar4 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (ppVar4->first).ht = psVar3->ht;
      psVar3 = (sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                *)((long)psVar3 + (ulong)bVar5 * -0x10 + 8);
      ppVar4 = (pair<google::sparse_hashtable_iterator<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>,_bool>
                *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    bVar1 = false;
  }
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(const_reference obj) {
    // First, double-check we're not inserting delkey
    assert(
        (!settings.use_deleted() || !equals(get_key(obj), key_info.delkey)) &&
        "Inserting the deleted key");
    const std::pair<size_type, size_type> pos = find_position(get_key(obj));
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table.get_iter(pos.first), table.nonempty_end()),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(obj, pos.second), true);
    }
  }